

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::SPPMIntegrator::SampleLd
          (SPPMIntegrator *this,SurfaceInteraction *intr,BSDF *bsdf,SampledWavelengths *lambda,
          SamplerHandle *sampler,LightSamplerHandle *lightSampler)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Vector3f wi_00;
  Vector3f wi_01;
  undefined1 auVar3 [16];
  LightSampleContext ctx;
  LightSampleContext ctx_00;
  undefined1 auVar4 [16];
  LightSampleContext ctx_01;
  undefined1 auVar5 [16];
  Vector3f wiRender;
  Vector3f wiRender_00;
  Vector3f wiRender_01;
  undefined1 auVar6 [16];
  SampledWavelengths lambda_00;
  Vector3f woRender;
  Vector3f woRender_00;
  Vector3f woRender_01;
  undefined1 auVar7 [16];
  Vector3f wiRender_02;
  undefined1 auVar8 [16];
  Vector3f woRender_02;
  undefined1 auVar9 [16];
  Vector3f woRender_03;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  array<float,_4> aVar41;
  bool bVar42;
  LightType type;
  int iVar43;
  SampledLight *pSVar44;
  undefined8 *in_RCX;
  SurfaceInteraction *in_RSI;
  long in_RDI;
  long *in_FS_OFFSET;
  Float FVar45;
  Float FVar46;
  Float FVar47;
  Point2f PVar48;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 extraout_XMM0_Qb_00;
  BSDF *pBVar52;
  undefined1 auVar49 [64];
  undefined1 auVar53 [56];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  Vector3<float> VVar57;
  SampledSpectrum SVar58;
  SampledSpectrum SVar59;
  Float weight_2;
  Float bsdfPDF_2;
  Float lightPDF_2;
  SampledSpectrum Le_1;
  LightHandle *light_1;
  const_iterator __end2;
  const_iterator __begin2;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *__range2;
  Float weight_1;
  Float bsdfPDF_1;
  Float lightPDF_1;
  LightHandle areaLight;
  SampledSpectrum Le;
  optional<pbrt::ShapeIntersection> si;
  Ray ray;
  SampledSpectrum f;
  Vector3f wi;
  BSDFSample bs;
  Float uScattering;
  Float weight;
  Float bsdfPDF;
  Float lightPDF;
  SampledSpectrum Li;
  SampledSpectrum f_1;
  Vector3f wi_1;
  Vector3f wo;
  LightLiSample ls;
  LightHandle light;
  Point2f uLight;
  optional<pbrt::SampledLight> sampledLight;
  SampledSpectrum Ld;
  Interval<float> in_stack_fffffffffffff458;
  Interval<float> in_stack_fffffffffffff460;
  Interval<float> in_stack_fffffffffffff468;
  Ray *in_stack_fffffffffffff470;
  Integrator *in_stack_fffffffffffff478;
  Interaction *in_stack_fffffffffffff480;
  Interaction *in_stack_fffffffffffff488;
  SurfaceInteraction *in_stack_fffffffffffff490;
  undefined8 in_stack_fffffffffffff498;
  LightSamplingMode mode;
  Vector3f *in_stack_fffffffffffff4a0;
  Interaction *in_stack_fffffffffffff4a8;
  float in_stack_fffffffffffff4bc;
  LightHandle *in_stack_fffffffffffff4c0;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffff4c8;
  undefined8 in_stack_fffffffffffff4d0;
  float in_stack_fffffffffffff4d8;
  float in_stack_fffffffffffff4dc;
  BSDF *in_stack_fffffffffffff4e0;
  undefined8 in_stack_fffffffffffff4e8;
  undefined8 in_stack_fffffffffffff4f0;
  undefined8 in_stack_fffffffffffff4f8;
  float in_stack_fffffffffffff500;
  undefined4 in_stack_fffffffffffff504;
  undefined8 in_stack_fffffffffffff508;
  undefined4 in_stack_fffffffffffff510;
  undefined4 in_stack_fffffffffffff514;
  Float in_stack_fffffffffffff518;
  Float in_stack_fffffffffffff51c;
  float in_stack_fffffffffffff520;
  undefined4 in_stack_fffffffffffff524;
  BxDFReflTransFlags in_stack_fffffffffffff528;
  float in_stack_fffffffffffff52c;
  undefined4 in_stack_fffffffffffff530;
  undefined4 in_stack_fffffffffffff534;
  Float in_stack_fffffffffffff53c;
  BSDF *in_stack_fffffffffffff540;
  undefined8 in_stack_fffffffffffff548;
  float in_stack_fffffffffffff550;
  undefined4 uStack_aac;
  undefined8 in_stack_fffffffffffff558;
  float in_stack_fffffffffffff560;
  undefined4 uStack_a9c;
  undefined8 in_stack_fffffffffffff568;
  float in_stack_fffffffffffff570;
  undefined4 uStack_a8c;
  Float local_9f4;
  undefined1 local_6c8 [32];
  Integrator *pIStack_6a8;
  Interaction *pIStack_6a0;
  LightSampleContext local_68c;
  float local_65c;
  undefined8 local_658;
  undefined8 local_650;
  undefined8 local_648;
  undefined8 local_640;
  undefined8 local_638;
  undefined8 local_630;
  reference local_628;
  LightHandle *local_620;
  __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
  local_618;
  long local_610;
  undefined8 local_604;
  undefined8 local_5fc;
  undefined8 local_5f4;
  undefined8 local_5ec;
  undefined8 local_5e4;
  undefined8 local_5dc;
  Float local_5d4;
  Tuple3<pbrt::Vector3,_float> local_5d0;
  undefined8 local_5c0;
  float local_5b8;
  Tuple3<pbrt::Vector3,_float> local_5b0;
  undefined8 local_5a0;
  float local_598;
  Float local_594;
  Tuple3<pbrt::Vector3,_float> local_590;
  Tuple3<pbrt::Vector3,_float> local_580;
  undefined1 local_570 [60];
  LightSampleContext local_534;
  float local_504;
  undefined8 local_4f8;
  undefined8 local_4f0;
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  float local_4d0;
  undefined8 local_4c8;
  float local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  optional local_4a8 [400];
  undefined8 local_318;
  undefined8 local_310;
  Tuple3<pbrt::Vector3,_float> local_308;
  undefined4 local_2fc;
  undefined8 local_2f8;
  float local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  float local_2d8;
  BSDFSample local_2d0;
  Float local_2ac;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 local_280;
  Float local_278;
  __0 local_271;
  Tuple3<pbrt::Vector3,_float> local_270;
  undefined8 local_260;
  float local_258;
  Tuple3<pbrt::Vector3,_float> local_250;
  undefined8 local_240;
  float local_238;
  Float local_230;
  undefined8 local_22c;
  undefined8 local_224;
  undefined8 local_21c;
  undefined8 local_214;
  float local_20c;
  float local_208 [2];
  float afStack_200 [2];
  Tuple3<pbrt::Vector3,_float> local_1f8;
  undefined8 local_1e8;
  float local_1e0;
  Tuple3<pbrt::Vector3,_float> local_1d8;
  undefined8 local_1c8;
  float local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  Tuple3<pbrt::Vector3,_float> local_198;
  undefined8 local_188;
  float local_180;
  Interaction *local_178;
  SurfaceInteraction *pSStack_170;
  undefined8 uStack_168;
  Vector3f *pVStack_160;
  undefined8 local_158;
  undefined1 local_150 [32];
  Integrator *pIStack_130;
  Interaction *pIStack_128;
  LightLiSample local_120;
  undefined8 local_90;
  LightSampleContext local_88;
  optional local_58 [40];
  undefined8 *local_30;
  SurfaceInteraction *local_20;
  undefined8 local_10;
  undefined8 local_8;
  undefined1 auVar56 [56];
  
  local_30 = in_RCX;
  local_20 = in_RSI;
  LightSampleContext::LightSampleContext(&local_88,in_RSI);
  SamplerHandle::Get1D((SamplerHandle *)in_stack_fffffffffffff460);
  LightSamplerHandle::Sample
            ((LightSamplerHandle *)in_stack_fffffffffffff488,
             (LightSampleContext *)in_stack_fffffffffffff480,
             (Float)((ulong)in_stack_fffffffffffff478 >> 0x20));
  PVar48 = SamplerHandle::Get2D((SamplerHandle *)in_stack_fffffffffffff458);
  auVar40._8_8_ = extraout_XMM0_Qb;
  auVar40._0_4_ = PVar48.super_Tuple2<pbrt::Point2,_float>.x;
  auVar40._4_4_ = PVar48.super_Tuple2<pbrt::Point2,_float>.y;
  local_90 = vmovlpd_avx(auVar40);
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)in_stack_fffffffffffff460,in_stack_fffffffffffff458.high);
  bVar42 = pstd::optional::operator_cast_to_bool(local_58);
  if (bVar42) {
    pstd::optional<pbrt::SampledLight>::operator->((optional<pbrt::SampledLight> *)0x7ada4e);
    LightHandle::LightHandle
              ((LightHandle *)in_stack_fffffffffffff460,(LightHandle *)in_stack_fffffffffffff458);
    LightSampleContext::LightSampleContext((LightSampleContext *)local_150,local_20);
    local_158 = local_90;
    in_stack_fffffffffffff488 = (Interaction *)*local_30;
    in_stack_fffffffffffff490 = (SurfaceInteraction *)local_30[1];
    in_stack_fffffffffffff498 = local_30[2];
    in_stack_fffffffffffff4a0 = (Vector3f *)local_30[3];
    ctx_01.pi.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = (float)(int)in_stack_fffffffffffff4e8
    ;
    ctx_01.pi.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high =
         (float)(int)((ulong)in_stack_fffffffffffff4e8 >> 0x20);
    ctx_01.pi.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x =
         (Interval<float>)in_stack_fffffffffffff4e0;
    ctx_01.pi.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low = (float)(int)in_stack_fffffffffffff4f0
    ;
    ctx_01.pi.super_Point3<pbrt::Interval<float>_>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high =
         (float)(int)((ulong)in_stack_fffffffffffff4f0 >> 0x20);
    ctx_01.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)in_stack_fffffffffffff4f8;
    ctx_01.n.super_Tuple3<pbrt::Normal3,_float>.y =
         (float)(int)((ulong)in_stack_fffffffffffff4f8 >> 0x20);
    ctx_01.n.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffff500;
    ctx_01.ns.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffff504;
    ctx_01.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)in_stack_fffffffffffff508;
    ctx_01.ns.super_Tuple3<pbrt::Normal3,_float>.z =
         (float)(int)((ulong)in_stack_fffffffffffff508 >> 0x20);
    lambda_00.lambda.values[1] = (float)in_stack_fffffffffffff514;
    lambda_00.lambda.values[0] = (float)in_stack_fffffffffffff510;
    lambda_00.lambda.values[2] = in_stack_fffffffffffff518;
    lambda_00.lambda.values[3] = in_stack_fffffffffffff51c;
    lambda_00.pdf.values[0] = in_stack_fffffffffffff520;
    lambda_00.pdf.values[1] = (float)in_stack_fffffffffffff524;
    lambda_00.pdf.values[2] = (float)in_stack_fffffffffffff528;
    lambda_00.pdf.values[3] = in_stack_fffffffffffff52c;
    local_178 = in_stack_fffffffffffff488;
    pSStack_170 = in_stack_fffffffffffff490;
    uStack_168 = in_stack_fffffffffffff498;
    pVStack_160 = in_stack_fffffffffffff4a0;
    LightHandle::SampleLi
              (in_stack_fffffffffffff4c0,ctx_01,(Point2f)in_stack_fffffffffffff4c8,lambda_00,
               (LightSamplingMode)in_stack_fffffffffffff4bc);
    bVar42 = LightLiSample::operator_cast_to_bool(&local_120);
    in_stack_fffffffffffff458 = (Interval<float>)local_150._0_8_;
    in_stack_fffffffffffff460 = (Interval<float>)local_150._8_8_;
    in_stack_fffffffffffff468 = (Interval<float>)local_150._16_8_;
    in_stack_fffffffffffff470 = (Ray *)local_150._24_8_;
    in_stack_fffffffffffff478 = pIStack_130;
    in_stack_fffffffffffff480 = pIStack_128;
    if ((bVar42) &&
       (bVar42 = SampledSpectrum::operator_cast_to_bool((SampledSpectrum *)local_150._16_8_),
       in_stack_fffffffffffff458 = (Interval<float>)local_150._0_8_,
       in_stack_fffffffffffff460 = (Interval<float>)local_150._8_8_,
       in_stack_fffffffffffff468 = (Interval<float>)local_150._16_8_,
       in_stack_fffffffffffff470 = (Ray *)local_150._24_8_, in_stack_fffffffffffff478 = pIStack_130,
       in_stack_fffffffffffff480 = pIStack_128, bVar42)) {
      local_1e0 = (local_20->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
      local_1e8._0_4_ = (local_20->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
      local_1e8._4_4_ = (local_20->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
      local_198.z = local_120.wi.super_Tuple3<pbrt::Vector3,_float>.z;
      local_198.x = local_120.wi.super_Tuple3<pbrt::Vector3,_float>.x;
      local_198.y = local_120.wi.super_Tuple3<pbrt::Vector3,_float>.y;
      local_1d8.z = local_120.wi.super_Tuple3<pbrt::Vector3,_float>.z;
      local_1d8.x = local_120.wi.super_Tuple3<pbrt::Vector3,_float>.x;
      local_1d8.y = local_120.wi.super_Tuple3<pbrt::Vector3,_float>.y;
      uVar50 = 0;
      uVar51 = 0;
      local_1f8.z = local_120.wi.super_Tuple3<pbrt::Vector3,_float>.z;
      local_1f8.x = local_120.wi.super_Tuple3<pbrt::Vector3,_float>.x;
      local_1f8.y = local_120.wi.super_Tuple3<pbrt::Vector3,_float>.y;
      woRender_03.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff570;
      woRender_03.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff568;
      woRender_03.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffff568 >> 0x20);
      wiRender_02.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff550;
      wiRender_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff548;
      wiRender_02.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffff548 >> 0x20);
      local_1c8 = local_1e8;
      local_1c0 = local_1e0;
      local_188 = local_1e8;
      local_180 = local_1e0;
      SVar58 = BSDF::f((BSDF *)CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530),
                       woRender_03,wiRender_02,(TransportMode)in_stack_fffffffffffff52c);
      auVar38._8_8_ = uVar51;
      auVar38._0_8_ = SVar58.values.values._8_8_;
      auVar39._8_8_ = uVar50;
      auVar39._0_8_ = SVar58.values.values._0_8_;
      local_1b8 = vmovlpd_avx(auVar39);
      local_1b0 = vmovlpd_avx(auVar38);
      AbsDot<float>((Vector3<float> *)local_150._8_8_,(Normal3<float> *)local_150._0_8_);
      uVar51 = 0;
      SVar58 = SampledSpectrum::operator*
                         ((SampledSpectrum *)local_150._8_8_,SUB84(local_150._0_8_,4));
      auVar36._8_8_ = uVar50;
      auVar36._0_8_ = SVar58.values.values._8_8_;
      auVar37._8_8_ = uVar51;
      auVar37._0_8_ = SVar58.values.values._0_8_;
      local_1a8 = vmovlpd_avx(auVar37);
      local_1a0 = vmovlpd_avx(auVar36);
      bVar42 = SampledSpectrum::operator_cast_to_bool((SampledSpectrum *)local_150._16_8_);
      in_stack_fffffffffffff458 = (Interval<float>)local_150._0_8_;
      in_stack_fffffffffffff460 = (Interval<float>)local_150._8_8_;
      in_stack_fffffffffffff468 = (Interval<float>)local_150._16_8_;
      in_stack_fffffffffffff470 = (Ray *)local_150._24_8_;
      in_stack_fffffffffffff478 = pIStack_130;
      in_stack_fffffffffffff480 = pIStack_128;
      if (bVar42) {
        local_208[0] = local_120.L.values.values[0];
        local_208[1] = local_120.L.values.values[1];
        afStack_200[0] = local_120.L.values.values[2];
        afStack_200[1] = local_120.L.values.values[3];
        bVar42 = Integrator::Unoccluded
                           ((Integrator *)in_stack_fffffffffffff490,in_stack_fffffffffffff488,
                            pIStack_128);
        in_stack_fffffffffffff458 = (Interval<float>)local_150._0_8_;
        in_stack_fffffffffffff460 = (Interval<float>)local_150._8_8_;
        in_stack_fffffffffffff468 = (Interval<float>)local_150._16_8_;
        in_stack_fffffffffffff470 = (Ray *)local_150._24_8_;
        in_stack_fffffffffffff478 = pIStack_130;
        in_stack_fffffffffffff480 = pIStack_128;
        if (bVar42) {
          pSVar44 = pstd::optional<pbrt::SampledLight>::operator->
                              ((optional<pbrt::SampledLight> *)0x7add54);
          uVar51 = 0;
          local_20c = pSVar44->pdf * local_120.pdf;
          uVar50 = 0;
          type = LightHandle::Type((LightHandle *)local_150._8_8_);
          bVar42 = IsDeltaLight(type);
          if (bVar42) {
            SVar58 = SampledSpectrum::operator*
                               ((SampledSpectrum *)local_150._16_8_,
                                (SampledSpectrum *)local_150._8_8_);
            auVar34._8_8_ = uVar51;
            auVar34._0_8_ = SVar58.values.values._8_8_;
            auVar35._8_8_ = uVar50;
            auVar35._0_8_ = SVar58.values.values._0_8_;
            local_22c = vmovlpd_avx(auVar35);
            local_224 = vmovlpd_avx(auVar34);
            uVar51 = 0;
            SVar58 = SampledSpectrum::operator/
                               ((SampledSpectrum *)local_150._16_8_,SUB84(local_150._8_8_,4));
            auVar32._8_8_ = uVar50;
            auVar32._0_8_ = SVar58.values.values._8_8_;
            auVar33._8_8_ = uVar51;
            auVar33._0_8_ = SVar58.values.values._0_8_;
            local_21c = vmovlpd_avx(auVar33);
            local_214 = vmovlpd_avx(auVar32);
            in_stack_fffffffffffff458 = (Interval<float>)local_150._0_8_;
            in_stack_fffffffffffff460 = (Interval<float>)local_150._8_8_;
            in_stack_fffffffffffff468 = (Interval<float>)local_150._16_8_;
            in_stack_fffffffffffff470 = (Ray *)local_150._24_8_;
            in_stack_fffffffffffff478 = pIStack_130;
            in_stack_fffffffffffff480 = pIStack_128;
            local_10 = local_21c;
            local_8 = local_214;
          }
          else {
            local_238 = local_180;
            local_240 = local_188;
            local_250.z = local_198.z;
            local_250.x = local_198.x;
            local_250.y = local_198.y;
            local_258 = local_180;
            local_260 = local_188;
            local_270.z = local_198.z;
            local_270.x = local_198.x;
            local_270.y = local_198.y;
            woRender.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff51c;
            woRender.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff518;
            woRender.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff520;
            wiRender.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff500;
            wiRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff4f8;
            wiRender.super_Tuple3<pbrt::Vector3,_float>.y =
                 (float)(int)((ulong)in_stack_fffffffffffff4f8 >> 0x20);
            local_230 = BSDF::PDF(in_stack_fffffffffffff4e0,woRender,wiRender,
                                  (TransportMode)in_stack_fffffffffffff4dc,
                                  (BxDFReflTransFlags)in_stack_fffffffffffff4d8);
            in_stack_fffffffffffff458 = (Interval<float>)local_150._0_8_;
            in_stack_fffffffffffff460 = (Interval<float>)local_150._8_8_;
            in_stack_fffffffffffff468 = (Interval<float>)local_150._16_8_;
            in_stack_fffffffffffff470 = (Ray *)local_150._24_8_;
            in_stack_fffffffffffff478 = pIStack_130;
            in_stack_fffffffffffff480 = pIStack_128;
            if ((SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle,pbrt::LightSamplerHandle)
                 ::reg == '\0') &&
               (iVar43 = __cxa_guard_acquire(&SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle,pbrt::LightSamplerHandle)
                                              ::reg),
               in_stack_fffffffffffff458 = (Interval<float>)local_150._0_8_,
               in_stack_fffffffffffff460 = (Interval<float>)local_150._8_8_,
               in_stack_fffffffffffff468 = (Interval<float>)local_150._16_8_,
               in_stack_fffffffffffff470 = (Ray *)local_150._24_8_,
               in_stack_fffffffffffff478 = pIStack_130, in_stack_fffffffffffff480 = pIStack_128,
               iVar43 != 0)) {
              SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle,pbrt::LightSamplerHandle)_const
              ::$_0::operator_cast_to_function_pointer(&local_271);
              StatRegisterer::StatRegisterer
                        ((StatRegisterer *)in_stack_fffffffffffff490,
                         (AccumFunc)in_stack_fffffffffffff488,(PixelAccumFunc)pIStack_128);
              __cxa_guard_release(&SampleLd(pbrt::SurfaceInteraction_const&,pbrt::BSDF_const&,pbrt::SampledWavelengths&,pbrt::SamplerHandle,pbrt::LightSamplerHandle)
                                   ::reg);
              in_stack_fffffffffffff458 = (Interval<float>)local_150._0_8_;
              in_stack_fffffffffffff460 = (Interval<float>)local_150._8_8_;
              in_stack_fffffffffffff468 = (Interval<float>)local_150._16_8_;
              in_stack_fffffffffffff470 = (Ray *)local_150._24_8_;
              in_stack_fffffffffffff478 = pIStack_130;
              in_stack_fffffffffffff480 = pIStack_128;
            }
            in_FS_OFFSET[-0x4b] = in_FS_OFFSET[-0x4b] + 1;
            bVar42 = BSDF::SampledPDFIsProportional((BSDF *)0x7adfcc);
            if (((!bVar42) && (local_230 == 0.0)) && (!NAN(local_230))) {
              *(long *)(*in_FS_OFFSET + -0x260) = *(long *)(*in_FS_OFFSET + -0x260) + 1;
            }
            uVar51 = 0;
            local_278 = PowerHeuristic(1,local_20c,1,local_230);
            uVar50 = 0;
            SVar58 = SampledSpectrum::operator*
                               ((SampledSpectrum *)in_stack_fffffffffffff468,
                                (SampledSpectrum *)in_stack_fffffffffffff460);
            auVar30._8_8_ = uVar51;
            auVar30._0_8_ = SVar58.values.values._8_8_;
            auVar31._8_8_ = uVar50;
            auVar31._0_8_ = SVar58.values.values._0_8_;
            local_2a8 = vmovlpd_avx(auVar31);
            local_2a0 = vmovlpd_avx(auVar30);
            uVar51 = 0;
            SVar58 = SampledSpectrum::operator*
                               ((SampledSpectrum *)in_stack_fffffffffffff460,
                                in_stack_fffffffffffff458.high);
            auVar28._8_8_ = uVar50;
            auVar28._0_8_ = SVar58.values.values._8_8_;
            auVar29._8_8_ = uVar51;
            auVar29._0_8_ = SVar58.values.values._0_8_;
            local_298 = vmovlpd_avx(auVar29);
            local_290 = vmovlpd_avx(auVar28);
            uVar50 = 0;
            SVar58 = SampledSpectrum::operator/
                               ((SampledSpectrum *)in_stack_fffffffffffff468,
                                in_stack_fffffffffffff460.high);
            auVar26._8_8_ = uVar51;
            auVar26._0_8_ = SVar58.values.values._8_8_;
            auVar27._8_8_ = uVar50;
            auVar27._0_8_ = SVar58.values.values._0_8_;
            local_288 = vmovlpd_avx(auVar27);
            local_280 = vmovlpd_avx(auVar26);
            local_10 = local_288;
            local_8 = local_280;
          }
        }
      }
    }
  }
  local_2ac = SamplerHandle::Get1D((SamplerHandle *)in_stack_fffffffffffff460);
  local_2d8 = (local_20->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
  local_2e0._0_4_ = (local_20->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
  local_2e0._4_4_ = (local_20->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
  PVar48 = SamplerHandle::Get2D((SamplerHandle *)in_stack_fffffffffffff458);
  auVar25._8_8_ = extraout_XMM0_Qb_00;
  auVar25._0_4_ = PVar48.super_Tuple2<pbrt::Point2,_float>.x;
  auVar25._4_4_ = PVar48.super_Tuple2<pbrt::Point2,_float>.y;
  local_2e8 = vmovlpd_avx(auVar25);
  local_2f0 = local_2d8;
  local_2f8 = local_2e0;
  uVar50 = 0;
  woRender_02.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff560;
  woRender_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff558;
  woRender_02.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffff558 >> 0x20);
  BSDF::Sample_f(in_stack_fffffffffffff540,woRender_02,in_stack_fffffffffffff53c,
                 (Point2f *)CONCAT44(in_stack_fffffffffffff534,in_stack_fffffffffffff530),
                 (TransportMode)in_stack_fffffffffffff52c,in_stack_fffffffffffff528);
  bVar42 = BSDFSample::operator_cast_to_bool(&local_2d0);
  if ((bVar42) &&
     (bVar42 = SampledSpectrum::operator_cast_to_bool((SampledSpectrum *)in_stack_fffffffffffff468),
     bVar42)) {
    local_308.z = local_2d0.wi.super_Tuple3<pbrt::Vector3,_float>.z;
    local_308.x = local_2d0.wi.super_Tuple3<pbrt::Vector3,_float>.x;
    local_308.y = local_2d0.wi.super_Tuple3<pbrt::Vector3,_float>.y;
    AbsDot<float>((Vector3<float> *)in_stack_fffffffffffff460,
                  (Normal3<float> *)in_stack_fffffffffffff458);
    uVar51 = 0;
    SVar58 = SampledSpectrum::operator*
                       ((SampledSpectrum *)in_stack_fffffffffffff460,in_stack_fffffffffffff458.high)
    ;
    auVar23._8_8_ = uVar50;
    auVar23._0_8_ = SVar58.values.values._8_8_;
    auVar24._8_8_ = uVar51;
    auVar24._0_8_ = SVar58.values.values._0_8_;
    auVar54 = ZEXT1664(auVar24);
    local_318 = vmovlpd_avx(auVar24);
    local_310 = vmovlpd_avx(auVar23);
    Interaction::SpawnRay(in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
    Ray::Ray((Ray *)in_stack_fffffffffffff460,(Ray *)in_stack_fffffffffffff458);
    auVar49 = ZEXT464(0x7f800000);
    Integrator::Intersect
              (in_stack_fffffffffffff478,in_stack_fffffffffffff470,in_stack_fffffffffffff468.high);
    bVar42 = pstd::optional::operator_cast_to_bool(local_4a8);
    mode = (LightSamplingMode)((ulong)in_stack_fffffffffffff498 >> 0x20);
    auVar53 = auVar49._8_56_;
    if (bVar42) {
      pstd::optional<pbrt::ShapeIntersection>::operator->
                ((optional<pbrt::ShapeIntersection> *)0x7ae406);
      VVar57 = Tuple3<pbrt::Vector3,_float>::operator-
                         ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff460);
      local_4d0 = VVar57.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar49._0_8_ = VVar57.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar49._8_56_ = auVar53;
      uVar51 = 0;
      uVar50 = auVar53._0_8_;
      local_4d8 = vmovlpd_avx(auVar49._0_16_);
      local_4c8 = local_4d8;
      local_4c0 = local_4d0;
      SVar58 = SurfaceInteraction::Le
                         (in_stack_fffffffffffff490,(Vector3f *)in_stack_fffffffffffff488,
                          (SampledWavelengths *)in_stack_fffffffffffff480);
      auVar21._8_8_ = uVar50;
      auVar21._0_8_ = SVar58.values.values._8_8_;
      auVar22._8_8_ = uVar51;
      auVar22._0_8_ = SVar58.values.values._0_8_;
      local_4b8 = vmovlpd_avx(auVar22);
      local_4b0 = vmovlpd_avx(auVar21);
      bVar42 = SampledSpectrum::operator_cast_to_bool((SampledSpectrum *)in_stack_fffffffffffff468);
      if (bVar42) {
        bVar42 = BSDFSample::IsSpecular((BSDFSample *)0x7ae50b);
        if (bVar42) {
          SVar58 = SampledSpectrum::operator*
                             ((SampledSpectrum *)in_stack_fffffffffffff468,
                              (SampledSpectrum *)in_stack_fffffffffffff460);
          auVar19._8_8_ = uVar51;
          auVar19._0_8_ = SVar58.values.values._8_8_;
          auVar20._8_8_ = uVar50;
          auVar20._0_8_ = SVar58.values.values._0_8_;
          local_4f8 = vmovlpd_avx(auVar20);
          local_4f0 = vmovlpd_avx(auVar19);
          uVar51 = 0;
          SVar58 = SampledSpectrum::operator/
                             ((SampledSpectrum *)in_stack_fffffffffffff468,
                              in_stack_fffffffffffff460.high);
          auVar17._8_8_ = uVar50;
          auVar17._0_8_ = SVar58.values.values._8_8_;
          auVar18._8_8_ = uVar51;
          auVar18._0_8_ = SVar58.values.values._0_8_;
          local_4e8 = vmovlpd_avx(auVar18);
          local_4e0 = vmovlpd_avx(auVar17);
          SampledSpectrum::operator+=
                    ((SampledSpectrum *)in_stack_fffffffffffff470,
                     (SampledSpectrum *)in_stack_fffffffffffff468);
        }
        else {
          pstd::optional<pbrt::ShapeIntersection>::operator->
                    ((optional<pbrt::ShapeIntersection> *)0x7ae60e);
          LightHandle::LightHandle
                    ((LightHandle *)in_stack_fffffffffffff460,
                     (LightHandle *)in_stack_fffffffffffff458);
          LightSampleContext::LightSampleContext(&local_534,local_20);
          LightHandle::LightHandle
                    ((LightHandle *)in_stack_fffffffffffff460,
                     (LightHandle *)in_stack_fffffffffffff458);
          FVar47 = LightSamplerHandle::PDF
                             ((LightSamplerHandle *)in_stack_fffffffffffff480,
                              (LightSampleContext *)in_stack_fffffffffffff478,
                              (LightHandle *)in_stack_fffffffffffff470);
          LightSampleContext::LightSampleContext((LightSampleContext *)local_570,local_20);
          local_580.z = local_308.z;
          local_580.x = local_308.x;
          local_580.y = local_308.y;
          local_590.z = local_308.z;
          local_590.x = local_308.x;
          local_590.y = local_308.y;
          ctx.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = in_stack_fffffffffffff4d8;
          ctx.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low =
               (float)(int)in_stack_fffffffffffff4d0;
          ctx.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high =
               (float)(int)((ulong)in_stack_fffffffffffff4d0 >> 0x20);
          ctx.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = in_stack_fffffffffffff4dc;
          ctx.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z =
               (Interval<float>)in_stack_fffffffffffff4e0;
          ctx.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)in_stack_fffffffffffff4e8;
          ctx.n.super_Tuple3<pbrt::Normal3,_float>.y =
               (float)(int)((ulong)in_stack_fffffffffffff4e8 >> 0x20);
          ctx.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)(int)in_stack_fffffffffffff4f0;
          ctx.ns.super_Tuple3<pbrt::Normal3,_float>.x =
               (float)(int)((ulong)in_stack_fffffffffffff4f0 >> 0x20);
          ctx.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)in_stack_fffffffffffff4f8;
          ctx.ns.super_Tuple3<pbrt::Normal3,_float>.z =
               (float)(int)((ulong)in_stack_fffffffffffff4f8 >> 0x20);
          wi_00.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_fffffffffffff4c0;
          wi_00.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff4bc;
          FVar46 = (Float)local_570._4_4_;
          FVar45 = LightHandle::PDF_Li((LightHandle *)in_stack_fffffffffffff4a0,ctx,wi_00,mode);
          local_504 = FVar47 * FVar45;
          bVar42 = BSDF::SampledPDFIsProportional((BSDF *)0x7ae758);
          if (bVar42) {
            local_5b8 = (local_20->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
            local_5c0._0_4_ = (local_20->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
            local_5c0._4_4_ = (local_20->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
            local_5b0.z = local_308.z;
            local_5b0.x = local_308.x;
            local_5b0.y = local_308.y;
            local_5d0.z = local_308.z;
            local_5d0.x = local_308.x;
            local_5d0.y = local_308.y;
            woRender_00.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff51c;
            woRender_00.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff518;
            woRender_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff520;
            wiRender_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff500;
            wiRender_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff4f8
            ;
            wiRender_00.super_Tuple3<pbrt::Vector3,_float>.y =
                 (float)(int)((ulong)in_stack_fffffffffffff4f8 >> 0x20);
            local_5a0 = local_5c0;
            local_598 = local_5b8;
            local_9f4 = BSDF::PDF(in_stack_fffffffffffff4e0,woRender_00,wiRender_00,
                                  (TransportMode)in_stack_fffffffffffff4dc,
                                  (BxDFReflTransFlags)in_stack_fffffffffffff4d8);
          }
          else {
            local_9f4 = local_2d0.pdf;
          }
          local_594 = local_9f4;
          uVar51 = 0;
          local_5d4 = PowerHeuristic(1,local_9f4,1,local_504);
          uVar50 = 0;
          SVar58 = SampledSpectrum::operator*
                             ((SampledSpectrum *)local_570._16_8_,(SampledSpectrum *)local_570._8_8_
                             );
          auVar15._8_8_ = uVar51;
          auVar15._0_8_ = SVar58.values.values._8_8_;
          auVar16._8_8_ = uVar50;
          auVar16._0_8_ = SVar58.values.values._0_8_;
          local_604 = vmovlpd_avx(auVar16);
          local_5fc = vmovlpd_avx(auVar15);
          uVar51 = 0;
          SVar58 = SampledSpectrum::operator*((SampledSpectrum *)local_570._8_8_,FVar46);
          auVar13._8_8_ = uVar50;
          auVar13._0_8_ = SVar58.values.values._8_8_;
          auVar14._8_8_ = uVar51;
          auVar14._0_8_ = SVar58.values.values._0_8_;
          local_5f4 = vmovlpd_avx(auVar14);
          local_5ec = vmovlpd_avx(auVar13);
          uVar50 = 0;
          SVar58 = SampledSpectrum::operator/
                             ((SampledSpectrum *)local_570._16_8_,SUB84(local_570._8_8_,4));
          auVar11._8_8_ = uVar51;
          auVar11._0_8_ = SVar58.values.values._8_8_;
          auVar12._8_8_ = uVar50;
          auVar12._0_8_ = SVar58.values.values._0_8_;
          local_5e4 = vmovlpd_avx(auVar12);
          local_5dc = vmovlpd_avx(auVar11);
          SampledSpectrum::operator+=
                    ((SampledSpectrum *)local_570._24_8_,(SampledSpectrum *)local_570._16_8_);
        }
      }
    }
    else {
      local_610 = in_RDI + 0x28;
      local_618._M_current =
           (LightHandle *)
           std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::begin
                     ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                      in_stack_fffffffffffff458);
      local_620 = (LightHandle *)
                  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::end
                            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                             in_stack_fffffffffffff458);
      SVar58.values.values[2] = (float)(int)in_stack_fffffffffffff4e8;
      SVar58.values.values[3] = (float)(int)((ulong)in_stack_fffffffffffff4e8 >> 0x20);
      SVar58.values.values[0] = (float)(int)in_stack_fffffffffffff4f8;
      SVar58.values.values[1] = (float)(int)((ulong)in_stack_fffffffffffff4f8 >> 0x20);
      while( true ) {
        auVar56 = auVar54._8_56_;
        auVar53 = auVar49._8_56_;
        bVar42 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
                             *)in_stack_fffffffffffff460,
                            (__normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
                             *)in_stack_fffffffffffff458);
        if (!bVar42) break;
        local_628 = __gnu_cxx::
                    __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
                    ::operator*(&local_618);
        SVar59 = LightHandle::Le((LightHandle *)in_stack_fffffffffffff480,
                                 (Ray *)in_stack_fffffffffffff478,
                                 (SampledWavelengths *)in_stack_fffffffffffff470);
        auVar55._0_8_ = SVar59.values.values._8_8_;
        auVar55._8_56_ = auVar56;
        auVar54._0_8_ = SVar59.values.values._0_8_;
        auVar54._8_56_ = auVar53;
        uVar50 = auVar56._0_8_;
        uVar51 = auVar53._0_8_;
        local_638 = vmovlpd_avx(auVar54._0_16_);
        local_630 = vmovlpd_avx(auVar55._0_16_);
        bVar42 = BSDFSample::IsSpecular((BSDFSample *)0x7aea7b);
        if (bVar42) {
          SVar59 = SampledSpectrum::operator*
                             ((SampledSpectrum *)in_stack_fffffffffffff468,
                              (SampledSpectrum *)in_stack_fffffffffffff460);
          uStack_a9c = (undefined4)((ulong)uVar51 >> 0x20);
          uStack_a8c = (undefined4)((ulong)uVar50 >> 0x20);
          auVar9._8_4_ = (int)uVar51;
          auVar9._0_8_ = SVar59.values.values._8_8_;
          auVar9._12_4_ = uStack_a9c;
          auVar10._8_4_ = (int)uVar50;
          auVar10._0_8_ = SVar59.values.values._0_8_;
          auVar10._12_4_ = uStack_a8c;
          uVar50 = auVar10._8_8_;
          local_658 = vmovlpd_avx(auVar10);
          local_650 = vmovlpd_avx(auVar9);
          uVar51 = 0;
          SVar59 = SampledSpectrum::operator/
                             ((SampledSpectrum *)in_stack_fffffffffffff468,
                              in_stack_fffffffffffff460.high);
          uStack_aac = (undefined4)((ulong)uVar51 >> 0x20);
          auVar7._8_8_ = uVar50;
          auVar7._0_8_ = SVar59.values.values._8_8_;
          auVar49 = ZEXT1664(auVar7);
          auVar8._8_4_ = (int)uVar51;
          auVar8._0_8_ = SVar59.values.values._0_8_;
          auVar8._12_4_ = uStack_aac;
          auVar54 = ZEXT1664(auVar8);
          local_648 = vmovlpd_avx(auVar8);
          local_640 = vmovlpd_avx(auVar7);
          SampledSpectrum::operator+=
                    ((SampledSpectrum *)in_stack_fffffffffffff470,
                     (SampledSpectrum *)in_stack_fffffffffffff468);
        }
        else {
          LightSampleContext::LightSampleContext(&local_68c,local_20);
          LightHandle::LightHandle
                    ((LightHandle *)in_stack_fffffffffffff460,
                     (LightHandle *)in_stack_fffffffffffff458);
          FVar46 = LightSamplerHandle::PDF
                             ((LightSamplerHandle *)in_stack_fffffffffffff480,
                              (LightSampleContext *)in_stack_fffffffffffff478,
                              (LightHandle *)in_stack_fffffffffffff470);
          LightSampleContext::LightSampleContext((LightSampleContext *)local_6c8,local_20);
          ctx_00.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = in_stack_fffffffffffff4d8;
          ctx_00.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low =
               (float)(int)in_stack_fffffffffffff4d0;
          ctx_00.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high =
               (float)(int)((ulong)in_stack_fffffffffffff4d0 >> 0x20);
          ctx_00.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = in_stack_fffffffffffff4dc;
          ctx_00.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z =
               (Interval<float>)in_stack_fffffffffffff4e0;
          ctx_00.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)SVar58.values.values._8_8_;
          ctx_00.n.super_Tuple3<pbrt::Normal3,_float>.y =
               (float)(int)((ulong)SVar58.values.values._8_8_ >> 0x20);
          ctx_00.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)(int)in_stack_fffffffffffff4f0;
          ctx_00.ns.super_Tuple3<pbrt::Normal3,_float>.x =
               (float)(int)((ulong)in_stack_fffffffffffff4f0 >> 0x20);
          ctx_00.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)SVar58.values.values._0_8_;
          ctx_00.ns.super_Tuple3<pbrt::Normal3,_float>.z =
               (float)(int)((ulong)SVar58.values.values._0_8_ >> 0x20);
          wi_01.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_fffffffffffff4c0;
          wi_01.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff4bc;
          in_stack_fffffffffffff458 = (Interval<float>)local_6c8._0_8_;
          in_stack_fffffffffffff460 = (Interval<float>)local_6c8._8_8_;
          in_stack_fffffffffffff468 = (Interval<float>)local_6c8._16_8_;
          in_stack_fffffffffffff470 = (Ray *)local_6c8._24_8_;
          in_stack_fffffffffffff478 = pIStack_6a8;
          in_stack_fffffffffffff480 = pIStack_6a0;
          FVar47 = LightHandle::PDF_Li((LightHandle *)in_stack_fffffffffffff4a0,ctx_00,wi_01,
                                       (LightSamplingMode)((ulong)in_stack_fffffffffffff498 >> 0x20)
                                      );
          local_65c = FVar46 * FVar47;
          bVar42 = BSDF::SampledPDFIsProportional((BSDF *)0x7aec7d);
          in_stack_fffffffffffff520 = (float)CONCAT13(bVar42,SUB43(in_stack_fffffffffffff520,0));
          FVar46 = local_2d0.pdf;
          if (bVar42) {
            woRender_01.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff51c;
            woRender_01.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff518;
            woRender_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff520;
            wiRender_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff500;
            wiRender_01.super_Tuple3<pbrt::Vector3,_float>.x =
                 (float)(int)SVar58.values.values._0_8_;
            wiRender_01.super_Tuple3<pbrt::Vector3,_float>.y =
                 (float)(int)((ulong)SVar58.values.values._0_8_ >> 0x20);
            in_stack_fffffffffffff51c =
                 BSDF::PDF(in_stack_fffffffffffff4e0,woRender_01,wiRender_01,
                           (TransportMode)in_stack_fffffffffffff4dc,
                           (BxDFReflTransFlags)in_stack_fffffffffffff4d8);
            FVar46 = in_stack_fffffffffffff51c;
          }
          in_stack_fffffffffffff518 = FVar46;
          in_stack_fffffffffffff4f0 = 0;
          PowerHeuristic(1,in_stack_fffffffffffff518,1,local_65c);
          uVar50 = 0;
          SVar58 = SampledSpectrum::operator*
                             ((SampledSpectrum *)in_stack_fffffffffffff468,
                              (SampledSpectrum *)in_stack_fffffffffffff460);
          in_stack_fffffffffffff500 = (float)uVar50;
          auVar5._8_8_ = in_stack_fffffffffffff4f0;
          auVar5._0_8_ = SVar58.values.values._8_8_;
          auVar6._8_4_ = in_stack_fffffffffffff500;
          auVar6._0_8_ = SVar58.values.values._0_8_;
          auVar6._12_4_ = (int)((ulong)uVar50 >> 0x20);
          in_stack_fffffffffffff4d0 = auVar6._8_8_;
          vmovlpd_avx(auVar6);
          vmovlpd_avx(auVar5);
          pBVar52 = (BSDF *)0x0;
          SVar59 = SampledSpectrum::operator*
                             ((SampledSpectrum *)in_stack_fffffffffffff460,
                              in_stack_fffffffffffff458.high);
          in_stack_fffffffffffff4d8 = SVar59.values.values[0];
          in_stack_fffffffffffff4dc = SVar59.values.values[1];
          auVar3._8_8_ = in_stack_fffffffffffff4d0;
          auVar3._0_8_ = SVar59.values.values._8_8_;
          auVar4._8_8_ = pBVar52;
          auVar4._0_8_ = SVar59.values.values._0_8_;
          vmovlpd_avx(auVar4);
          vmovlpd_avx(auVar3);
          in_stack_fffffffffffff4c0 = (LightHandle *)0x0;
          in_stack_fffffffffffff4e0 = pBVar52;
          SVar59 = SampledSpectrum::operator/
                             ((SampledSpectrum *)in_stack_fffffffffffff468,
                              in_stack_fffffffffffff460.high);
          in_stack_fffffffffffff4bc = SVar59.values.values[1];
          auVar1._8_8_ = pBVar52;
          auVar1._0_8_ = SVar59.values.values._8_8_;
          auVar49 = ZEXT1664(auVar1);
          auVar2._8_8_ = in_stack_fffffffffffff4c0;
          auVar2._0_8_ = SVar59.values.values._0_8_;
          auVar54 = ZEXT1664(auVar2);
          vmovlpd_avx(auVar2);
          vmovlpd_avx(auVar1);
          SampledSpectrum::operator+=
                    ((SampledSpectrum *)in_stack_fffffffffffff470,
                     (SampledSpectrum *)in_stack_fffffffffffff468);
        }
        __gnu_cxx::
        __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
        ::operator++(&local_618);
      }
    }
    local_2fc = 1;
    pstd::optional<pbrt::ShapeIntersection>::~optional
              ((optional<pbrt::ShapeIntersection> *)0x7aeee2);
  }
  else {
    local_2fc = 1;
  }
  pstd::optional<pbrt::SampledLight>::~optional((optional<pbrt::SampledLight> *)0x7aeeef);
  aVar41.values[2] = (float)(undefined4)local_8;
  aVar41.values[3] = (float)local_8._4_4_;
  aVar41.values[0] = (float)(undefined4)local_10;
  aVar41.values[1] = (float)local_10._4_4_;
  return (array<float,_4>)(array<float,_4>)aVar41.values;
}

Assistant:

SampledSpectrum SPPMIntegrator::SampleLd(const SurfaceInteraction &intr, const BSDF &bsdf,
                                         SampledWavelengths &lambda,
                                         SamplerHandle sampler,
                                         LightSamplerHandle lightSampler) const {
    // NOTE: share fragments from PathIntegrator::SampleLd here...
    pstd::optional<SampledLight> sampledLight =
        lightSampler.Sample(intr, sampler.Get1D());

    Point2f uLight = sampler.Get2D();

    SampledSpectrum Ld(0.f);

    if (sampledLight) {
        LightHandle light = sampledLight->light;
        DCHECK(light != nullptr && sampledLight->pdf > 0);

        // Sample light source with multiple importance sampling
        LightLiSample ls =
            light.SampleLi(intr, uLight, lambda, LightSamplingMode::WithMIS);
        if (ls && ls.L) {
            // Evaluate BSDF for light sampling strategy
            Vector3f wo = intr.wo, wi = ls.wi;
            SampledSpectrum f = bsdf.f(wo, wi) * AbsDot(wi, intr.shading.n);
            if (f) {
                SampledSpectrum Li = ls.L;
                if (Unoccluded(intr, ls.pLight)) {
                    // Add light's contribution to reflected radiance
                    Float lightPDF = sampledLight->pdf * ls.pdf;
                    if (IsDeltaLight(light.Type()))
                        Ld = f * Li / lightPDF;
                    else {
                        Float bsdfPDF = bsdf.PDF(wo, wi);
                        CHECK_RARE(1e-6, bsdf.SampledPDFIsProportional() == false &&
                                             bsdfPDF == 0);
                        Float weight = PowerHeuristic(1, lightPDF, 1, bsdfPDF);
                        Ld = f * Li * weight / lightPDF;
                    }
                }
            }
        }
    }

    Float uScattering = sampler.Get1D();
    BSDFSample bs = bsdf.Sample_f(intr.wo, uScattering, sampler.Get2D());
    if (!bs || !bs.f)
        return Ld;

    Vector3f wi = bs.wi;
    SampledSpectrum f = bs.f * AbsDot(wi, intr.shading.n);

    Ray ray = intr.SpawnRay(wi);
    pstd::optional<ShapeIntersection> si = Intersect(ray);
    if (si) {
        SampledSpectrum Le = si->intr.Le(-ray.d, lambda);
        if (Le) {
            if (bs.IsSpecular())
                Ld += f * Le / bs.pdf;
            else {
                // Compute MIS pdf...
                LightHandle areaLight(si->intr.areaLight);
                Float lightPDF = lightSampler.PDF(intr, areaLight) *
                                 areaLight.PDF_Li(intr, wi, LightSamplingMode::WithMIS);
                Float bsdfPDF =
                    bsdf.SampledPDFIsProportional() ? bsdf.PDF(intr.wo, wi) : bs.pdf;
                Float weight = PowerHeuristic(1, bsdfPDF, 1, lightPDF);
                Ld += f * Le * weight / bs.pdf;
            }
        }
    } else {
        for (const auto &light : infiniteLights) {
            SampledSpectrum Le = light.Le(ray, lambda);
            if (bs.IsSpecular())
                Ld += f * Le / bs.pdf;
            else {
                // Compute MIS pdf...
                Float lightPDF = lightSampler.PDF(intr, light) *
                                 light.PDF_Li(intr, wi, LightSamplingMode::WithMIS);
                Float bsdfPDF =
                    bsdf.SampledPDFIsProportional() ? bsdf.PDF(intr.wo, wi) : bs.pdf;
                Float weight = PowerHeuristic(1, bsdfPDF, 1, lightPDF);
                Ld += f * Le * weight / bs.pdf;
            }
        }
    }
    return Ld;
}